

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O2

void __thiscall chrono::ChSolverAPGD::Solve(ChSolverAPGD *this)

{
  ChSystemDescriptor *in_RSI;
  
  Solve((ChSolverAPGD *)
        &this[-1].r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
        in_RSI);
  return;
}

Assistant:

double ChSolverAPGD::Solve(ChSystemDescriptor& sysd) {
    bool verbose = false;
    const std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    const std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();
    if (verbose)
        std::cout << "Number of constraints: " << mconstraints.size()
                  << "\nNumber of variables  : " << mvariables.size() << std::endl;

    // Update auxiliary data in all constraints before starting,
    // that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    double L, t;
    double theta;
    double thetaNew;
    double Beta;
    double obj1, obj2;

    nc = sysd.CountActiveConstraints();
    gamma_hat.resize(nc);
    gammaNew.resize(nc);
    g.resize(nc);
    y.resize(nc);
    gamma.resize(nc);
    yNew.resize(nc);
    r.resize(nc);
    tmp.resize(nc);

    residual = 10e30;

    Beta = 0.0;
    obj1 = 0.0;
    obj2 = 0.0;

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    ShurBvectorCompute(sysd);

    // If no constraints, return now. Variables contain M^-1 * f after call to ShurBvectorCompute.
    // This early exit is needed, else we get division by zero and a potential infinite loop.
    if (nc == 0) {
        return 0;
    }

    // Optimization: backup the  q  sparse data computed above,
    // because   (M^-1)*k   will be needed at the end when computing primals.
    ChVectorDynamic<> Minvk;
    sysd.FromVariablesToVector(Minvk, true);

    // (1) gamma_0 = zeros(nc,1)
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }
    sysd.FromConstraintsToVector(gamma);

    // (2) gamma_hat_0 = ones(nc,1)
    gamma_hat.setConstant(1.0);

    // (3) y_0 = gamma_0
    y = gamma;

    // (4) theta_0 = 1
    theta = 1.0;

    // (5) L_k = norm(N * (gamma_0 - gamma_hat_0)) / norm(gamma_0 - gamma_hat_0)
    tmp = gamma - gamma_hat;
    L = tmp.norm();
    sysd.ShurComplementProduct(yNew, tmp, nullptr);  // yNew = N * tmp = N * (gamma - gamma_hat)
    L = yNew.norm() / L;
    yNew.setZero();  //// RADU  is this really necessary here?

    // (6) t_k = 1 / L_k
    t = 1.0 / L;

    //// RADU
    //// Check correctness (e.g. sign of 'r' in comments vs. code)

    // (7) for k := 0 to N_max
    for (m_iterations = 0; m_iterations < m_max_iterations; m_iterations++) {
        // (8) g = N * y_k - r
        // (9) gamma_(k+1) = ProjectionOperator(y_k - t_k * g)
        sysd.ShurComplementProduct(g, y);  // g = N * y
        gammaNew = y - t * (g + r);
        sysd.ConstraintsProject(gammaNew);

        // (10) while 0.5 * gamma_(k+1)' * N * gamma_(k+1) - gamma_(k+1)' * r >=
        //            0.5 * y_k' * N * y_k - y_k' * r + g' * (gamma_(k+1) - y_k) + 0.5 * L_k * norm(gamma_(k+1) - y_k)^2
        sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew;
        obj1 = gammaNew.dot(0.5 * tmp + r);

        sysd.ShurComplementProduct(tmp, y);  // tmp = N * y;
        obj2 = y.dot(0.5 * tmp + r) + (gammaNew - y).dot(g + 0.5 * L * (gammaNew - y));

        while (obj1 >= obj2) {
            // (11) L_k = 2 * L_k
            L = 2.0 * L;

            // (12) t_k = 1 / L_k
            t = 1.0 / L;

            // (13) gamma_(k+1) = ProjectionOperator(y_k - t_k * g)
            gammaNew = y - t * g;
            sysd.ConstraintsProject(gammaNew);

            // Update obj1 and obj2
            sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew;
            obj1 = gammaNew.dot(0.5 * tmp + r);

            sysd.ShurComplementProduct(tmp, y);  // tmp = N * y;
            obj2 = y.dot(0.5 * tmp + r) + (gammaNew - y).dot(g + 0.5 * L * (gammaNew - y));
        }  // (14) endwhile

        // (15) theta_(k+1) = (-theta_k^2 + theta_k * sqrt(theta_k^2 + 4)) / 2
        thetaNew = (-theta * theta + theta * sqrt(theta * theta + 4.0)) / 2.0;

        // (16) Beta_(k+1) = theta_k * (1 - theta_k) / (theta_k^2 + theta_(k+1))
        Beta = theta * (1.0 - theta) / (theta * theta + thetaNew);

        // (17) y_(k+1) = gamma_(k+1) + Beta_(k+1) * (gamma_(k+1) - gamma_k)
        yNew = gammaNew + Beta * (gammaNew - gamma);

        // (18) r = r(gamma_(k+1))
        double res = Res4(sysd);

        if (res < residual) {      // (19) if r < epsilon_min
            residual = res;        // (20) r_min = r
            gamma_hat = gammaNew;  // (21) gamma_hat = gamma_(k+1)
        }                          // (22) endif

        if (residual < m_tolerance) {  // (23) if r < Tau
            break;                         // (24) break
        }                                  // (25) endif

        if (g.dot(gammaNew - gamma) > 0) {  // (26) if g' * (gamma_(k+1) - gamma_k) > 0
            yNew = gammaNew;                // (27) y_(k+1) = gamma_(k+1)
            thetaNew = 1.0;                 // (28) theta_(k+1) = 1
        }                                   // (29) endif

        // (30) L_k = 0.9 * L_k
        L = 0.9 * L;

        // (31) t_k = 1 / L_k
        t = 1.0 / L;

        // perform some tasks at the end of the iteration
        if (this->record_violation_history) {
            AtIterationEnd(residual, (gammaNew - gamma).lpNorm<Eigen::Infinity>(), m_iterations);
        }

        // Update iterates
        theta = thetaNew;
        gamma = gammaNew;
        y = yNew;
    }  // (32) endfor

    if (verbose)
        std::cout << "Residual: " << residual << ", Iter: " << m_iterations << std::endl;

    // (33) return Value at time step t_(l+1), gamma_(l+1) := gamma_hat
    sysd.FromVectorToConstraints(gamma_hat);

    // Resulting PRIMAL variables:
    // compute the primal variables as   v = (M^-1)(k + D*l)
    // v = (M^-1)*k  ...    (by rewinding to the backup vector computed at the beginning)
    sysd.FromVectorToVariables(Minvk);

    // ... + (M^-1)*D*l     (this increment and also stores 'qb' in the ChVariable items)
    for (size_t ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive())
            mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    }

    return residual;
}